

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ArchiveIN(ChLinkLock *this,ChArchiveIn *marchive)

{
  LinkType link_type;
  ChLinkForce *force_D_ptr;
  LinkType_mapper typemapper;
  LinkType local_ac;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_a8;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_88;
  ChNameValue<chrono::ChLinkForce_*> local_68;
  ChNameValue<double> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChLinkLock::LinkType>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkLock>(marchive);
  ChLinkMarkers::ArchiveIN(&this->super_ChLinkMarkers,marchive);
  my_enum_mappers_types::LinkType_mapper::LinkType_mapper((LinkType_mapper *)&local_88);
  my_enum_mappers_types::LinkType_mapper::operator()
            (&local_a8,(LinkType_mapper *)&local_88,&local_ac);
  local_38._name = "link_type";
  local_38._flags = '\0';
  local_38._value = &local_a8;
  ChArchiveIn::operator>>(marchive,&local_38);
  ChEnumMapper<chrono::ChLinkLock::LinkType>::~ChEnumMapper(&local_a8);
  ChangeLinkType(this,local_ac);
  local_50._value = &this->d_restlength;
  local_50._name = "d_restlength";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._name = "force_D_ptr";
  local_68._flags = '\0';
  local_68._value = (ChLinkForce **)&local_a8;
  ChArchiveIn::operator>>(marchive,&local_68);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_D,(pointer)local_a8.super_ChEnumMapperBase._vptr_ChEnumMapperBase);
  ChEnumMapper<chrono::ChLinkLock::LinkType>::~ChEnumMapper(&local_88);
  return;
}

Assistant:

void ChLinkLock::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkLock>();

    // deserialize parent class
    ChLinkMarkers::ArchiveIN(marchive);

    // deserialize all member data
    my_enum_mappers_types::LinkType_mapper typemapper;
    LinkType link_type;
    marchive >> CHNVP(typemapper(link_type), "link_type");
    ChangeLinkType(link_type);

    ////if (mask) delete (mask); marchive >> CHNVP(mask); //// TODO: needed?

    marchive >> CHNVP(d_restlength);

    {
        ChLinkForce* force_D_ptr;
        marchive >> CHNVP(force_D_ptr);
        force_D.reset(force_D_ptr);
    }
    ////marchive >> CHNVP(force_D);
    ////marchive >> CHNVP(force_R);
    ////marchive >> CHNVP(force_X);
    ////marchive >> CHNVP(force_Y);
    ////marchive >> CHNVP(force_Z);
    ////marchive >> CHNVP(force_Rx);
    ////marchive >> CHNVP(force_Ry);
    ////marchive >> CHNVP(force_Rz);

    ////marchive >> CHNVP(limit_X);
    ////marchive >> CHNVP(limit_Y);
    ////marchive >> CHNVP(limit_Z);
    ////marchive >> CHNVP(limit_Rx);
    ////marchive >> CHNVP(limit_Ry);
    ////marchive >> CHNVP(limit_Rz);
    ////marchive >> CHNVP(limit_Rp);
    ////marchive >> CHNVP(limit_D);
}